

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_BayesianProbitRegressor_2eproto::TableStruct::InitDefaultsImpl
               (void)

{
  BayesianProbitRegressor_Gaussian *pBVar1;
  BayesianProbitRegressor_FeatureValueWeight *pBVar2;
  BayesianProbitRegressor *pBVar3;
  
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O0/mlmodel/format/BayesianProbitRegressor.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::BayesianProbitRegressor_Gaussian>::DefaultConstruct
            ((ExplicitlyConstructed<CoreML::Specification::BayesianProbitRegressor_Gaussian> *)
             _BayesianProbitRegressor_Gaussian_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>
                    *)_BayesianProbitRegressor_FeatureValueWeight_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>
                    *)_BayesianProbitRegressor_FeatureWeight_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::BayesianProbitRegressor>
  ::DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::BayesianProbitRegressor> *)
                     _BayesianProbitRegressor_default_instance_);
  pBVar1 = BayesianProbitRegressor_Gaussian::internal_default_instance();
  pBVar2 = google::protobuf::internal::
           ExplicitlyConstructed<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>
           ::get_mutable((ExplicitlyConstructed<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>
                          *)_BayesianProbitRegressor_FeatureValueWeight_default_instance_);
  pBVar2->featureweight_ = pBVar1;
  pBVar1 = BayesianProbitRegressor_Gaussian::internal_default_instance();
  pBVar3 = google::protobuf::internal::
           ExplicitlyConstructed<CoreML::Specification::BayesianProbitRegressor>::get_mutable
                     ((ExplicitlyConstructed<CoreML::Specification::BayesianProbitRegressor> *)
                      _BayesianProbitRegressor_default_instance_);
  pBVar3->bias_ = pBVar1;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  _BayesianProbitRegressor_Gaussian_default_instance_.DefaultConstruct();
  _BayesianProbitRegressor_FeatureValueWeight_default_instance_.DefaultConstruct();
  _BayesianProbitRegressor_FeatureWeight_default_instance_.DefaultConstruct();
  _BayesianProbitRegressor_default_instance_.DefaultConstruct();
  _BayesianProbitRegressor_FeatureValueWeight_default_instance_.get_mutable()->featureweight_ = const_cast< ::CoreML::Specification::BayesianProbitRegressor_Gaussian*>(
      ::CoreML::Specification::BayesianProbitRegressor_Gaussian::internal_default_instance());
  _BayesianProbitRegressor_default_instance_.get_mutable()->bias_ = const_cast< ::CoreML::Specification::BayesianProbitRegressor_Gaussian*>(
      ::CoreML::Specification::BayesianProbitRegressor_Gaussian::internal_default_instance());
}